

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytField.cpp
# Opt level: O2

void __thiscall ki::dml::Field<signed_char>::read_from(Field<signed_char> *this,istream *istream)

{
  ostream *poVar1;
  parse_error *this_00;
  ValueBytes<signed_char> data;
  string local_1b0;
  ostringstream oss;
  
  data.value = '\0';
  std::istream::read((char *)istream,(long)&data);
  if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) == 0) {
    this->m_value = (char)data;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Not enough data was available to read BYT value (");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_FieldBase).m_name);
  std::operator<<(poVar1,").");
  this_00 = (parse_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  parse_error::parse_error(this_00,&local_1b0);
  __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BytField::read_from(std::istream &istream)
	{
		ValueBytes<BYT> data;
		istream.read(data.buff, sizeof(BYT));
		if (istream.fail())
		{
			std::ostringstream oss;
			oss << "Not enough data was available to read BYT value (" << m_name << ").";
			throw parse_error(oss.str());
		}
		m_value = data.value;
	}